

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_min.hpp
# Opt level: O1

__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
 burst::
 select_min<__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>,burst::compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
           (__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
            first,__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
                  last,
           compose_fn<burst::apply_fn<std::less<void>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>
           compare)

{
  iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  iVar1;
  __normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
  _Var2;
  __normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
  _Var3;
  integer_range<int> *piVar4;
  undefined1 local_4a [2];
  int local_48;
  int local_44;
  integer_range<int> *local_40;
  integer_range<int> *local_38;
  
  if (first._M_current != last._M_current) {
    piVar4 = first._M_current + 1;
    _Var2._M_current = first._M_current;
    if (piVar4 != last._M_current) {
      _Var3._M_current = first._M_current;
      do {
        local_40 = _Var3._M_current;
        local_38 = piVar4;
        detail::
        by_all_impl<0ul,1ul,burst::front_t,std::tuple<boost::integer_range<int>&,boost::integer_range<int>&>>
                  (&local_48,local_4a,&local_40);
        _Var2._M_current = first._M_current;
        if ((local_44 < local_48) ||
           ((local_40 = piVar4, local_38 = _Var3._M_current,
            detail::
            by_all_impl<0ul,1ul,burst::front_t,std::tuple<boost::integer_range<int>&,boost::integer_range<int>&>>
                      (&local_48,local_4a,&local_40), _Var2._M_current = _Var3._M_current,
            local_48 <= local_44 &&
            (_Var2._M_current = _Var3._M_current + 1, piVar4 + -1 != _Var3._M_current)))) {
          iVar1 = ((_Var2._M_current)->
                  super_iterator_range<boost::range_detail::integer_iterator<int>_>).
                  super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
                  .
                  super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                  .
                  super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ;
          ((_Var2._M_current)->super_iterator_range<boost::range_detail::integer_iterator<int>_>).
          super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
          .
          super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               = (piVar4->super_iterator_range<boost::range_detail::integer_iterator<int>_>).
                 super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
                 .
                 super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                 .
                 super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ;
          (piVar4->super_iterator_range<boost::range_detail::integer_iterator<int>_>).
          super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
          .
          super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               = iVar1;
        }
        piVar4 = piVar4 + 1;
        _Var3._M_current = _Var2._M_current;
      } while (piVar4 != last._M_current);
    }
    first._M_current = _Var2._M_current + 1;
  }
  return (__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
          )first._M_current;
}

Assistant:

auto select_min (ForwardIterator first, ForwardIterator last, BinaryPredicate compare)
    {
        if (first != last)
        {
            auto min = first;

            for (auto current = std::next(first); current != last; ++current)
            {
                if (compare(*current, *min))
                {
                    std::iter_swap(first, current);
                    min = first;
                }
                else if (not compare(*min, *current))
                {
                    ++min;
                    if (min != current)
                    {
                        std::iter_swap(min, current);
                    }
                }
            }

            return ++min;
        }

        return first;
    }